

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionNameArguments *args)

{
  uint uVar1;
  MSLFormatResolution MVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  MSLConstexprSampler *pMVar6;
  SPIRCombinedImageSampler *pSVar7;
  long *plVar8;
  const_iterator cVar9;
  runtime_error *prVar10;
  long *plVar11;
  uint32_t id;
  char *pcVar12;
  uint chain;
  ulong uVar13;
  char *pcVar14;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  chain = (args->base).img.id;
  uVar13 = (ulong)chain;
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,chain);
  if (pSVar5 == (SPIRVariable *)0x0) {
    bVar4 = false;
    pMVar6 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar5->basevariable).id;
    if (id == 0) {
      id = (pSVar5->super_IVariant).self.id;
    }
    pMVar6 = find_constexpr_sampler(this,id);
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar5->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  if ((((this->msl_options).swizzle_texture_samples == true) &&
      ((args->base).is_gather == true && bVar4 == false)) &&
     ((pMVar6 == (MSLConstexprSampler *)0x0 || (pMVar6->ycbcr_conversion_enable == false)))) {
    local_78 = (long *)CONCAT44(local_78._4_4_,chain);
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,
                   (key_type *)&local_78);
    pcVar14 = "spvGatherCompareSwizzle";
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pcVar14 = "spvGatherSwizzle";
    }
    pcVar12 = pcVar14 + 0x17;
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pcVar12 = pcVar14 + 0x10;
    }
    add_spv_func_and_recompile
              (this,cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                    (__node_type *)0x0 ^ SPVFuncImplGatherCompareSwizzle);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar14,pcVar12);
  }
  else {
    if ((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr,
       pVVar3[uVar13].type == TypeCombinedImageSampler)) {
      pSVar7 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar3 + uVar13);
    }
    else {
      pSVar7 = (SPIRCombinedImageSampler *)0x0;
    }
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (((pMVar6 == (MSLConstexprSampler *)0x0) || (pMVar6->ycbcr_conversion_enable != true)) ||
       (uVar1 = pMVar6->planes, bVar4 != false || uVar1 < 2)) {
      if (pSVar7 != (SPIRCombinedImageSampler *)0x0) {
        chain = (pSVar7->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,chain,true);
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_68 = *plVar11;
        lStack_60 = plVar8[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar11;
        local_78 = (long *)*plVar8;
      }
      local_70 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (args->has_dref != true) {
        return __return_storage_ptr__;
      }
    }
    else {
      if ((uVar1 & 0xfffffffe) != 2) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78 = &local_68;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Unhandled number of color image planes!","");
        ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
        *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar6->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMVar6->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        add_spv_func_and_recompile(this,(uVar1 != 2) + SPVFuncImplChromaReconstructNearest2Plane);
        ::std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x3766be);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x3766da);
      MVar2 = pMVar6->resolution;
      if (MVar2 == MSL_FORMAT_RESOLUTION_422) {
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          add_spv_func_and_recompile
                    (this,(pMVar6->planes != 2) +
                          SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid chroma location.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
            *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          add_spv_func_and_recompile
                    (this,(pMVar6->planes != 2) +
                          SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
        }
      }
      else {
        if (MVar2 != MSL_FORMAT_RESOLUTION_420) {
          if (MVar2 != MSL_FORMAT_RESOLUTION_444) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid format resolution.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
            *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x28ea,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,(pMVar6->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78 = &local_68;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
              *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,(pMVar6->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
          }
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78 = &local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Invalid X chroma location.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
            *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,(pMVar6->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78 = &local_68;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar10,(string *)&local_78);
              *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,(pMVar6->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
          }
        }
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		bool is_compare = comparison_ids.count(img);
		add_spv_func_and_recompile(is_compare ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return is_compare ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}